

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

void __thiscall
FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation
          (DoubleToStringConverter *this,char *decimal_digits,int length,int decimal_point,
          int digits_after_point,StringBuilder *result_builder)

{
  int remaining_digits_1;
  int remaining_digits;
  StringBuilder *result_builder_local;
  int digits_after_point_local;
  int decimal_point_local;
  int length_local;
  char *decimal_digits_local;
  DoubleToStringConverter *this_local;
  
  if (decimal_point < 1) {
    StringBuilder::AddCharacter(result_builder,'0');
    if (0 < digits_after_point) {
      StringBuilder::AddCharacter(result_builder,'.');
      StringBuilder::AddPadding(result_builder,'0',-decimal_point);
      if (digits_after_point + decimal_point < length) {
        __assert_fail("length <= digits_after_point - (-decimal_point)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x7e,
                      "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                     );
      }
      StringBuilder::AddSubstring(result_builder,decimal_digits,length);
      StringBuilder::AddPadding(result_builder,'0',(digits_after_point + decimal_point) - length);
    }
  }
  else if (decimal_point < length) {
    if (digits_after_point < 1) {
      __assert_fail("digits_after_point > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x8d,
                    "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                   );
    }
    StringBuilder::AddSubstring(result_builder,decimal_digits,decimal_point);
    StringBuilder::AddCharacter(result_builder,'.');
    if (digits_after_point < length - decimal_point) {
      __assert_fail("length - decimal_point <= digits_after_point",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x90,
                    "void FIX::double_conversion::DoubleToStringConverter::CreateDecimalRepresentation(const char *, int, int, int, StringBuilder *) const"
                   );
    }
    StringBuilder::AddSubstring
              (result_builder,decimal_digits + decimal_point,length - decimal_point);
    StringBuilder::AddPadding(result_builder,'0',digits_after_point - (length - decimal_point));
  }
  else {
    StringBuilder::AddSubstring(result_builder,decimal_digits,length);
    StringBuilder::AddPadding(result_builder,'0',decimal_point - length);
    if (0 < digits_after_point) {
      StringBuilder::AddCharacter(result_builder,'.');
      StringBuilder::AddPadding(result_builder,'0',digits_after_point);
    }
  }
  if (digits_after_point == 0) {
    if ((this->flags_ & 2U) != 0) {
      StringBuilder::AddCharacter(result_builder,'.');
    }
    if ((this->flags_ & 4U) != 0) {
      StringBuilder::AddCharacter(result_builder,'0');
    }
  }
  return;
}

Assistant:

void DoubleToStringConverter::CreateDecimalRepresentation(
    const char* decimal_digits,
    int length,
    int decimal_point,
    int digits_after_point,
    StringBuilder* result_builder) const {
  // Create a representation that is padded with zeros if needed.
  if (decimal_point <= 0) {
      // "0.00000decimal_rep".
    result_builder->AddCharacter('0');
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', -decimal_point);
      ASSERT(length <= digits_after_point - (-decimal_point));
      result_builder->AddSubstring(decimal_digits, length);
      int remaining_digits = digits_after_point - (-decimal_point) - length;
      result_builder->AddPadding('0', remaining_digits);
    }
  } else if (decimal_point >= length) {
    // "decimal_rep0000.00000" or "decimal_rep.0000"
    result_builder->AddSubstring(decimal_digits, length);
    result_builder->AddPadding('0', decimal_point - length);
    if (digits_after_point > 0) {
      result_builder->AddCharacter('.');
      result_builder->AddPadding('0', digits_after_point);
    }
  } else {
    // "decima.l_rep000"
    ASSERT(digits_after_point > 0);
    result_builder->AddSubstring(decimal_digits, decimal_point);
    result_builder->AddCharacter('.');
    ASSERT(length - decimal_point <= digits_after_point);
    result_builder->AddSubstring(&decimal_digits[decimal_point],
                                 length - decimal_point);
    int remaining_digits = digits_after_point - (length - decimal_point);
    result_builder->AddPadding('0', remaining_digits);
  }
  if (digits_after_point == 0) {
    if ((flags_ & EMIT_TRAILING_DECIMAL_POINT) != 0) {
      result_builder->AddCharacter('.');
    }
    if ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) {
      result_builder->AddCharacter('0');
    }
  }
}